

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O0

void beltWBLStepDBase(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  undefined1 *in_RSI;
  ulong *in_RDI;
  size_t i;
  word n;
  belt_wbl_st *st;
  void *in_stack_ffffffffffffffc8;
  undefined1 *in_stack_ffffffffffffffd0;
  
  *(ulong *)(in_RDX + 0x10) = ((ulong)(in_RSI + 0xf) >> 4) << 1;
  while (*(long *)(in_RDX + 0x10) != 0) {
    *(undefined8 *)(in_RDX + 8) = *(undefined8 *)((long)in_RDI + (long)(in_RSI + -0x10));
    *(undefined8 *)(in_RDX + 10) = *(undefined8 *)((long)in_RDI + (long)(in_RSI + -8));
    memMove(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x141aac);
    *in_RDI = *(ulong *)(in_RDX + 8);
    in_RDI[1] = *(ulong *)(in_RDX + 10);
    beltBlockEncr((octet *)(in_RDX + 8),in_RDX);
    memXor2(in_RDX + 8,in_RDX + 0x10,8);
    *(ulong *)((long)in_RDI + (long)(in_RSI + -0x10)) =
         *(ulong *)(in_RDX + 8) ^ *(ulong *)((long)in_RDI + (long)(in_RSI + -0x10));
    *(ulong *)((long)in_RDI + (long)(in_RSI + -8)) =
         *(ulong *)(in_RDX + 10) ^ *(ulong *)((long)in_RDI + (long)(in_RSI + -8));
    for (in_stack_ffffffffffffffd0 = &DAT_00000010; in_stack_ffffffffffffffd0 + 0x10 < in_RSI;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 0x10) {
      *in_RDI = *(ulong *)((long)in_RDI + (long)in_stack_ffffffffffffffd0) ^ *in_RDI;
      in_RDI[1] = *(ulong *)((long)(in_RDI + 1) + (long)in_stack_ffffffffffffffd0) ^ in_RDI[1];
    }
    *(long *)(in_RDX + 0x10) = *(long *)(in_RDX + 0x10) + -1;
  }
  return;
}

Assistant:

void beltWBLStepDBase(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	for (st->round = 2 * n; st->round; --st->round)
	{
		size_t i;
		// block <- r*
		beltBlockCopy(st->block, (octet*)buf + count - 16);
		// r <- ShHi^128(r)
		memMove((octet*)buf + 16, buf, count - 16);
		// r1 <- block
		beltBlockCopy(buf, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + count - 16, st->block);
		// r1 <- r1 + r2 + ... + r_{n-1}
		for (i = 16; i + 16 < count; i += 16)
			beltBlockXor2(buf, (octet*)buf + i);
	}
}